

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O1

bool __thiscall
iDynTree::SixAxisForceTorqueSensor::getWrenchAppliedOnLinkInverseMatrix
          (SixAxisForceTorqueSensor *this,LinkIndex link_index,
          Matrix6x6 *wrench_applied_on_link_inverse_matrix)

{
  bool bVar1;
  Transform sensor_H_link;
  undefined4 local_148;
  uint uStack_144;
  undefined4 uStack_140;
  uint uStack_13c;
  undefined4 local_138;
  uint uStack_134;
  undefined4 uStack_130;
  uint uStack_12c;
  undefined4 local_128;
  uint uStack_124;
  undefined4 uStack_120;
  uint uStack_11c;
  undefined4 local_118;
  uint uStack_114;
  undefined4 uStack_110;
  uint uStack_10c;
  undefined4 local_108;
  uint uStack_104;
  undefined4 uStack_100;
  uint uStack_fc;
  undefined4 local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  undefined4 local_e8;
  uint uStack_e4;
  undefined4 uStack_e0;
  uint uStack_dc;
  undefined4 local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  uint uStack_cc;
  undefined4 local_c8;
  uint uStack_c4;
  undefined4 uStack_c0;
  uint uStack_bc;
  undefined4 local_b8;
  uint uStack_b4;
  undefined4 uStack_b0;
  uint uStack_ac;
  undefined4 local_a8;
  uint uStack_a4;
  undefined4 uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  uint uStack_94;
  undefined4 uStack_90;
  uint uStack_8c;
  undefined4 local_88;
  uint uStack_84;
  undefined4 uStack_80;
  uint uStack_7c;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  uint uStack_5c;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  undefined4 local_38;
  uint uStack_34;
  undefined4 uStack_30;
  uint uStack_2c;
  
  if ((this->pimpl->link1 == link_index) || (this->pimpl->link2 == link_index)) {
    iDynTree::Transform::inverse();
    if (this->pimpl->appliedWrenchLink == link_index) {
      iDynTree::Transform::asAdjointTransformWrench();
      wrench_applied_on_link_inverse_matrix->m_data[0] = (double)CONCAT44(uStack_144,local_148);
      wrench_applied_on_link_inverse_matrix->m_data[1] = (double)CONCAT44(uStack_13c,uStack_140);
      wrench_applied_on_link_inverse_matrix->m_data[2] = (double)CONCAT44(uStack_134,local_138);
      wrench_applied_on_link_inverse_matrix->m_data[3] = (double)CONCAT44(uStack_12c,uStack_130);
      wrench_applied_on_link_inverse_matrix->m_data[4] = (double)CONCAT44(uStack_124,local_128);
      wrench_applied_on_link_inverse_matrix->m_data[5] = (double)CONCAT44(uStack_11c,uStack_120);
      wrench_applied_on_link_inverse_matrix->m_data[6] = (double)CONCAT44(uStack_114,local_118);
      wrench_applied_on_link_inverse_matrix->m_data[7] = (double)CONCAT44(uStack_10c,uStack_110);
      wrench_applied_on_link_inverse_matrix->m_data[8] = (double)CONCAT44(uStack_104,local_108);
      wrench_applied_on_link_inverse_matrix->m_data[9] = (double)CONCAT44(uStack_fc,uStack_100);
      wrench_applied_on_link_inverse_matrix->m_data[10] = (double)CONCAT44(uStack_f4,local_f8);
      wrench_applied_on_link_inverse_matrix->m_data[0xb] = (double)CONCAT44(uStack_ec,uStack_f0);
      wrench_applied_on_link_inverse_matrix->m_data[0xc] = (double)CONCAT44(uStack_e4,local_e8);
      wrench_applied_on_link_inverse_matrix->m_data[0xd] = (double)CONCAT44(uStack_dc,uStack_e0);
      wrench_applied_on_link_inverse_matrix->m_data[0xe] = (double)CONCAT44(uStack_d4,local_d8);
      wrench_applied_on_link_inverse_matrix->m_data[0xf] = (double)CONCAT44(uStack_cc,uStack_d0);
      wrench_applied_on_link_inverse_matrix->m_data[0x10] = (double)CONCAT44(uStack_c4,local_c8);
      wrench_applied_on_link_inverse_matrix->m_data[0x11] = (double)CONCAT44(uStack_bc,uStack_c0);
      wrench_applied_on_link_inverse_matrix->m_data[0x12] = (double)CONCAT44(uStack_b4,local_b8);
      wrench_applied_on_link_inverse_matrix->m_data[0x13] = (double)CONCAT44(uStack_ac,uStack_b0);
      wrench_applied_on_link_inverse_matrix->m_data[0x14] = (double)CONCAT44(uStack_a4,local_a8);
      wrench_applied_on_link_inverse_matrix->m_data[0x15] = (double)CONCAT44(uStack_9c,uStack_a0);
      wrench_applied_on_link_inverse_matrix->m_data[0x16] = (double)CONCAT44(uStack_94,local_98);
      wrench_applied_on_link_inverse_matrix->m_data[0x17] = (double)CONCAT44(uStack_8c,uStack_90);
      wrench_applied_on_link_inverse_matrix->m_data[0x18] = (double)CONCAT44(uStack_84,local_88);
      wrench_applied_on_link_inverse_matrix->m_data[0x19] = (double)CONCAT44(uStack_7c,uStack_80);
      wrench_applied_on_link_inverse_matrix->m_data[0x1a] = (double)CONCAT44(uStack_74,local_78);
      wrench_applied_on_link_inverse_matrix->m_data[0x1b] = (double)CONCAT44(uStack_6c,uStack_70);
      wrench_applied_on_link_inverse_matrix->m_data[0x1c] = (double)CONCAT44(uStack_64,local_68);
      wrench_applied_on_link_inverse_matrix->m_data[0x1d] = (double)CONCAT44(uStack_5c,uStack_60);
      wrench_applied_on_link_inverse_matrix->m_data[0x1e] = (double)CONCAT44(uStack_54,local_58);
      wrench_applied_on_link_inverse_matrix->m_data[0x1f] = (double)CONCAT44(uStack_4c,uStack_50);
      wrench_applied_on_link_inverse_matrix->m_data[0x20] = (double)CONCAT44(uStack_44,local_48);
      wrench_applied_on_link_inverse_matrix->m_data[0x21] = (double)CONCAT44(uStack_3c,uStack_40);
      wrench_applied_on_link_inverse_matrix->m_data[0x22] = (double)CONCAT44(uStack_34,local_38);
      wrench_applied_on_link_inverse_matrix->m_data[0x23] = (double)CONCAT44(uStack_2c,uStack_30);
    }
    else {
      iDynTree::Transform::asAdjointTransformWrench();
      *(undefined4 *)wrench_applied_on_link_inverse_matrix->m_data = local_148;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 4) = uStack_144 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 1) = uStack_140;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xc) = uStack_13c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 2) = local_138;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x14) =
           uStack_134 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 3) = uStack_130;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x1c) =
           uStack_12c ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 4) = local_128;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x24) =
           uStack_124 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 5) = uStack_120;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x2c) =
           uStack_11c ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 6) = local_118;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x34) =
           uStack_114 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 7) = uStack_110;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x3c) =
           uStack_10c ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 8) = local_108;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x44) =
           uStack_104 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 9) = uStack_100;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x4c) = uStack_fc ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 10) = local_f8;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x54) = uStack_f4 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0xb) = uStack_f0;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x5c) = uStack_ec ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0xc) = local_e8;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 100) = uStack_e4 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0xd) = uStack_e0;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x6c) = uStack_dc ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0xe) = local_d8;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x74) = uStack_d4 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0xf) = uStack_d0;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x7c) = uStack_cc ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x10) = local_c8;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x84) = uStack_c4 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x11) = uStack_c0;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x8c) = uStack_bc ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x12) = local_b8;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x94) = uStack_b4 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x13) = uStack_b0;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x9c) = uStack_ac ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x14) = local_a8;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xa4) = uStack_a4 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x15) = uStack_a0;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xac) = uStack_9c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x16) = local_98;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xb4) = uStack_94 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x17) = uStack_90;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xbc) = uStack_8c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x18) = local_88;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xc4) = uStack_84 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x19) = uStack_80;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xcc) = uStack_7c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x1a) = local_78;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xd4) = uStack_74 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x1b) = uStack_70;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xdc) = uStack_6c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x1c) = local_68;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xe4) = uStack_64 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x1d) = uStack_60;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xec) = uStack_5c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x1e) = local_58;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xf4) = uStack_54 ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x1f) = uStack_50;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0xfc) = uStack_4c ^ 0x80000000
      ;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x20) = local_48;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x104) =
           uStack_44 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x21) = uStack_40;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x10c) =
           uStack_3c ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x22) = local_38;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x114) =
           uStack_34 ^ 0x80000000;
      *(undefined4 *)(wrench_applied_on_link_inverse_matrix->m_data + 0x23) = uStack_30;
      *(uint *)((long)wrench_applied_on_link_inverse_matrix->m_data + 0x11c) =
           uStack_2c ^ 0x80000000;
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
    memset(wrench_applied_on_link_inverse_matrix,0,0x120);
  }
  return bVar1;
}

Assistant:

bool SixAxisForceTorqueSensor::getWrenchAppliedOnLinkInverseMatrix(const LinkIndex link_index,
                                                                   Matrix6x6& wrench_applied_on_link_inverse_matrix) const
{
    assert(this->isValid());

    if( link_index == this->pimpl->link1 )
    {
        Transform sensor_H_link = this->pimpl->link1_H_sensor.inverse();
        // If the measure wrench is the one applied on the other link, change sign
        if( this->getAppliedWrenchLink() != link_index )
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = -toEigen(sensor_H_link.asAdjointTransformWrench());
        }
        else
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = toEigen(sensor_H_link.asAdjointTransformWrench());
        }

        return true;
    }
    else if( link_index == this->pimpl->link2 )
    {
        Transform sensor_H_link = this->pimpl->link2_H_sensor.inverse();

        if( this->getAppliedWrenchLink() != link_index )
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = -toEigen(sensor_H_link.asAdjointTransformWrench());
        }
        else
        {
            toEigen(wrench_applied_on_link_inverse_matrix) = toEigen(sensor_H_link.asAdjointTransformWrench());
        }

        return true;
    }
    else
    {
        assert(false);
        wrench_applied_on_link_inverse_matrix.zero();
        return false;
    }
}